

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O0

void init_task_list(task_list_t *thing)

{
  task_list_t *thing_local;
  
  thing->lo[0] = 0;
  thing->lo[1] = 0;
  thing->hi[0] = 0;
  thing->hi[1] = 0;
  thing->dim[0] = 0;
  thing->dim[1] = 0;
  thing->chunkBId = 0;
  thing->do_put = 0;
  return;
}

Assistant:

static inline void init_task_list(task_list_t *thing)
{
    thing->lo[0] = 0;
    thing->lo[1] = 0;
    thing->hi[0] = 0;
    thing->hi[1] = 0;
    thing->dim[0] = 0;
    thing->dim[1] = 0;
    thing->chunkBId = 0;
    thing->do_put = 0;
}